

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionArgument.cpp
# Opt level: O0

FunctionArgument * __thiscall
ninx::parser::element::FunctionArgument::clone_impl(FunctionArgument *this)

{
  bool bVar1;
  FunctionArgument *this_00;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_38 [3];
  undefined1 local_20 [8];
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_18;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  default_value_copy;
  FunctionArgument *this_local;
  
  default_value_copy._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
        )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )this;
  std::
  unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
  ::unique_ptr<std::default_delete<ninx::parser::element::Expression>,void>
            ((unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
              *)&local_18,(nullptr_t)0x0);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->default_value);
  if (bVar1) {
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::operator->(&this->default_value);
    ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)local_20);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::operator=(&local_18,
                (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)local_20);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                   *)local_20);
  }
  this_00 = (FunctionArgument *)operator_new(0x40);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::unique_ptr(local_38,&local_18);
  FunctionArgument(this_00,&this->name,local_38);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr(local_38);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr(&local_18);
  return this_00;
}

Assistant:

ninx::parser::element::FunctionArgument *ninx::parser::element::FunctionArgument::clone_impl() {
    std::unique_ptr<Expression> default_value_copy {nullptr};
    if (this->default_value) {
        default_value_copy = this->default_value->clone<Expression>();
    }

    return new FunctionArgument(this->name, std::move(default_value_copy));
}